

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O2

void __thiscall
de::ArrayBuffer<int,_4UL,_4UL>::setStorage(ArrayBuffer<int,_4UL,_4UL> *this,size_t numElements)

{
  void *pvVar1;
  size_t sVar2;
  ArrayBuffer<int,_4UL,_4UL> newBuffer;
  ArrayBuffer<int,_4UL,_4UL> local_20;
  
  ArrayBuffer(&local_20,numElements);
  pvVar1 = this->m_ptr;
  sVar2 = this->m_cap;
  this->m_ptr = local_20.m_ptr;
  this->m_cap = local_20.m_cap;
  local_20.m_ptr = pvVar1;
  local_20.m_cap = sVar2;
  clear(&local_20);
  return;
}

Assistant:

void ArrayBuffer<T,Alignment,Stride>::setStorage (size_t numElements)
{
	// create new buffer of the wanted size, swap to it
	ArrayBuffer<T,Alignment,Stride> newBuffer(numElements);
	swap(newBuffer);
}